

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void inplace_flip_container(roaring_array_t *x1_arr,uint16_t hb,uint16_t lb_start,uint16_t lb_end)

{
  ushort uVar1;
  int iVar2;
  bool bVar3;
  run_container_t *c;
  _Bool _Var4;
  uint8_t uVar5;
  array_container_t *paVar6;
  long lVar7;
  int iVar8;
  uint8_t uVar9;
  uint uVar10;
  long lVar11;
  run_container_t *run;
  uint i;
  uint uVar12;
  uint uVar13;
  uint8_t local_31;
  run_container_t *local_30;
  
  iVar8 = x1_arr->size;
  if (((long)iVar8 == 0) || (x1_arr->keys[(long)iVar8 + -1] == hb)) {
    i = iVar8 - 1;
  }
  else {
    uVar12 = iVar8 - 1;
    uVar10 = 0;
    uVar13 = uVar12;
    do {
      if ((int)uVar12 < (int)uVar10) {
        i = ~uVar10;
        break;
      }
      i = uVar10 + uVar12 >> 1;
      uVar1 = *(ushort *)((long)x1_arr->keys + (ulong)(uVar10 + uVar12 & 0xfffffffe));
      if (uVar1 < hb) {
        uVar10 = i + 1;
        bVar3 = true;
        i = uVar13;
      }
      else if (hb < uVar1) {
        uVar12 = i - 1;
        bVar3 = true;
        i = uVar13;
      }
      else {
        bVar3 = false;
      }
      uVar13 = i;
    } while (bVar3);
  }
  if ((int)i < 0) {
    uVar13 = (uint)lb_start;
    uVar10 = lb_end + 1;
    if (uVar13 <= uVar10) {
      iVar8 = lb_end - uVar13;
      if (iVar8 + 2U < 3) {
        paVar6 = array_container_create_range(uVar13,uVar10);
        uVar9 = '\x02';
      }
      else {
        paVar6 = (array_container_t *)run_container_create_given_capacity(1);
        uVar9 = '\x03';
        if (paVar6 != (array_container_t *)0x0) {
          iVar2 = paVar6->cardinality;
          *(uint *)(paVar6->array + (long)iVar2 * 2) = iVar8 * 0x10000 | uVar13;
          paVar6->cardinality = iVar2 + 1;
        }
      }
      ra_insert_new_key_value_at(x1_arr,~i,hb,paVar6,uVar9);
      return;
    }
    __assert_fail("range_end >= range_start",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x1131,"container_t *container_range_of_ones(uint32_t, uint32_t, uint8_t *)");
  }
  local_31 = x1_arr->typecodes[i & 0xffff];
  paVar6 = (array_container_t *)x1_arr->containers[i & 0xffff];
  if (local_31 == '\x04') {
    paVar6 = (array_container_t *)
             shared_container_extract_copy((shared_container_t *)paVar6,&local_31);
  }
  uVar13 = (uint)lb_start;
  iVar8 = lb_end + 1;
  local_30 = (run_container_t *)0x0;
  if (local_31 == '\x03') {
    iVar8 = run_container_negation_range_inplace((run_container_t *)paVar6,uVar13,iVar8,&local_30);
    uVar9 = (uint8_t)iVar8;
  }
  else if (local_31 == '\x02') {
    _Var4 = array_container_negation_range(paVar6,uVar13,iVar8,&local_30);
    array_container_free(paVar6);
    uVar9 = '\x02' - _Var4;
  }
  else {
    if (local_31 != '\x01') {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x188f,
                    "container_t *container_inot_range(container_t *, uint8_t, uint32_t, uint32_t, uint8_t *)"
                   );
    }
    _Var4 = bitset_container_negation_range_inplace
                      ((bitset_container_t *)paVar6,uVar13,iVar8,&local_30);
    uVar9 = '\x02' - _Var4;
  }
  c = local_30;
  run = local_30;
  uVar5 = uVar9;
  if (uVar9 == '\x04') {
    uVar5 = *(uint8_t *)&local_30->runs;
    if (uVar5 == '\x04') {
      __assert_fail("*type != SHARED_CONTAINER_TYPE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x1062,
                    "const container_t *container_unwrap_shared(const container_t *, uint8_t *)");
    }
    run = *(run_container_t **)local_30;
  }
  if (uVar5 == '\x03') {
    lVar7 = cpuid_Extended_Feature_Enumeration_info(7);
    if ((*(uint *)(lVar7 + 4) & 0x20) == 0) {
      iVar8 = run->n_runs;
      lVar7 = (long)iVar8;
      if (0 < lVar7) {
        lVar11 = 0;
        do {
          iVar8 = iVar8 + (uint)run->runs[lVar11].length;
          lVar11 = lVar11 + 1;
        } while (lVar7 != lVar11);
      }
    }
    else {
      iVar8 = _avx2_run_container_cardinality(run);
    }
  }
  else {
    if ((uVar5 != '\x02') && (uVar5 != '\x01')) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x10fa,"int container_get_cardinality(const container_t *, uint8_t)");
    }
    iVar8 = run->n_runs;
  }
  if (iVar8 == 0) {
    container_free(c,uVar9);
    ra_remove_at_index(x1_arr,i);
    return;
  }
  if ((int)i < x1_arr->size) {
    x1_arr->containers[i] = c;
    x1_arr->typecodes[i] = uVar9;
    return;
  }
  __assert_fail("i < ra->size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                ,0x1a3a,
                "void ra_set_container_at_index(const roaring_array_t *, int32_t, container_t *, uint8_t)"
               );
}

Assistant:

static void inplace_flip_container(roaring_array_t *x1_arr, uint16_t hb,
                                   uint16_t lb_start, uint16_t lb_end) {
    const int i = ra_get_index(x1_arr, hb);
    uint8_t ctype_in, ctype_out;
    container_t *flipped_container = NULL;
    if (i >= 0) {
        container_t *container_to_flip =
            ra_get_container_at_index(x1_arr, i, &ctype_in);
        flipped_container = container_inot_range(
            container_to_flip, ctype_in, (uint32_t)lb_start,
            (uint32_t)(lb_end + 1), &ctype_out);
        // if a new container was created, the old one was already freed
        if (container_get_cardinality(flipped_container, ctype_out)) {
            ra_set_container_at_index(x1_arr, i, flipped_container, ctype_out);
        } else {
            container_free(flipped_container, ctype_out);
            ra_remove_at_index(x1_arr, i);
        }

    } else {
        flipped_container = container_range_of_ones(
            (uint32_t)lb_start, (uint32_t)(lb_end + 1), &ctype_out);
        ra_insert_new_key_value_at(x1_arr, -i - 1, hb, flipped_container,
                                   ctype_out);
    }
}